

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatQueue.c
# Opt level: O0

Msat_Queue_t * Msat_QueueAlloc(int nVars)

{
  Msat_Queue_t *__s;
  int *piVar1;
  Msat_Queue_t *p;
  int nVars_local;
  
  __s = (Msat_Queue_t *)malloc(0x18);
  memset(__s,0,0x18);
  __s->nVars = nVars;
  piVar1 = (int *)malloc((long)nVars << 2);
  __s->pVars = piVar1;
  return __s;
}

Assistant:

Msat_Queue_t * Msat_QueueAlloc( int nVars )
{
    Msat_Queue_t * p;
    p = ABC_ALLOC( Msat_Queue_t, 1 );
    memset( p, 0, sizeof(Msat_Queue_t) );
    p->nVars  = nVars;
    p->pVars  = ABC_ALLOC( int, nVars );
    return p;
}